

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_uint nk_tt__find_table(nk_byte *data,nk_uint fontstart,char *tag)

{
  uint uVar1;
  ulong uVar2;
  undefined4 in_register_00000034;
  uint *puVar3;
  bool bVar4;
  
  uVar2 = (ulong)(ushort)(*(ushort *)(data + 4) << 8 | *(ushort *)(data + 4) >> 8);
  puVar3 = (uint *)(data + 0x14);
  while( true ) {
    bVar4 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar4) {
      return 0;
    }
    if (((((uint)(byte)puVar3[-2] == (int)*(char *)CONCAT44(in_register_00000034,fontstart)) &&
         ((uint)*(byte *)((long)puVar3 + -7) ==
          (int)*(char *)(CONCAT44(in_register_00000034,fontstart) + 1))) &&
        ((uint)*(byte *)((long)puVar3 + -6) ==
         (int)*(char *)(CONCAT44(in_register_00000034,fontstart) + 2))) &&
       ((uint)*(byte *)((long)puVar3 + -5) ==
        (int)*(char *)(CONCAT44(in_register_00000034,fontstart) + 3))) break;
    puVar3 = puVar3 + 4;
  }
  uVar1 = *puVar3;
  return uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
}

Assistant:

NK_INTERN nk_uint
nk_tt__find_table(const nk_byte *data, nk_uint fontstart, const char *tag)
{
    /* @OPTIMIZE: binary search */
    nk_int num_tables = nk_ttUSHORT(data+fontstart+4);
    nk_uint tabledir = fontstart + 12;
    nk_int i;
    for (i = 0; i < num_tables; ++i) {
        nk_uint loc = tabledir + (nk_uint)(16*i);
        if (nk_tt_tag(data+loc+0, tag))
            return nk_ttULONG(data+loc+8);
    }
    return 0;
}